

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O3

void Gia_ManCollapseDeref(DdManager *dd,Vec_Ptr_t *vFuncs)

{
  int iVar1;
  long lVar2;
  
  iVar1 = vFuncs->nSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if ((DdNode *)vFuncs->pArray[lVar2] != (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,(DdNode *)vFuncs->pArray[lVar2]);
        iVar1 = vFuncs->nSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (vFuncs->pArray != (void **)0x0) {
    free(vFuncs->pArray);
  }
  free(vFuncs);
  return;
}

Assistant:

void Gia_ManCollapseDeref( DdManager * dd, Vec_Ptr_t * vFuncs )
{
    DdNode * bFunc; int i;
    Vec_PtrForEachEntry( DdNode *, vFuncs, bFunc, i )
        if ( bFunc )
            Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncs );
}